

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

DisconnectResult __thiscall
Chainstate::DisconnectBlock
          (Chainstate *this,CBlock *block,CBlockIndex *pindex,CCoinsViewCache *view)

{
  long lVar1;
  CTransaction *this_00;
  pointer pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *fmt;
  ulong uVar7;
  uint uVar8;
  DisconnectResult DVar9;
  long lVar10;
  pointer pCVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  CBlockUndo blockUndo;
  Coin coin;
  COutPoint out;
  base_blob<256U> local_78;
  Txid hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = ::node::BlockManager::UndoReadFromDisk(this->m_blockman,&blockUndo,pindex);
  if (bVar3) {
    if (((long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 + 1 ==
        (long)(block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4) {
      iVar6 = pindex->nHeight;
      if (iVar6 == 0x1664a) {
        CBlockIndex::GetBlockHash((uint256 *)&coin,pindex);
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = 0x8e;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = 0xd0;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = 'M';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = 'W';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = 0xf2;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = 0xf3;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = 0xcd;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = 0xc6;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = 0xa6;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = 0xe5;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = 'U';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = 'i';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = 0xdc;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\x16';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = 'T';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = 0xe1;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf2;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\x19';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = 0x84;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\x7f';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = 'f';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = 0xe7;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '&';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = 0xdc;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = 0xa2;
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = 'q';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\x02';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        bVar4 = ::operator==((base_blob<256U> *)&coin,(base_blob<256U> *)&out);
        bVar3 = true;
        if (!bVar4) {
          iVar6 = pindex->nHeight;
          goto LAB_0035cbad;
        }
      }
      else {
LAB_0035cbad:
        if (iVar6 == 0x166a4) {
          CBlockIndex::GetBlockHash((uint256 *)&hash,pindex);
          local_78.m_data._M_elems[0] = '/';
          local_78.m_data._M_elems[1] = 'o';
          local_78.m_data._M_elems[2] = '0';
          local_78.m_data._M_elems[3] = 0xf9;
          local_78.m_data._M_elems[4] = 0xd6;
          local_78.m_data._M_elems[5] = 0x83;
          local_78.m_data._M_elems[6] = 0xde;
          local_78.m_data._M_elems[7] = 0xb8;
          local_78.m_data._M_elems[8] = ']';
          local_78.m_data._M_elems[9] = 0x93;
          local_78.m_data._M_elems[10] = '\x14';
          local_78.m_data._M_elems[0xb] = 0xef;
          local_78.m_data._M_elems[0xc] = ']';
          local_78.m_data._M_elems[0xd] = 0xcf;
          local_78.m_data._M_elems[0xe] = '6';
          local_78.m_data._M_elems[0xf] = 0xaf;
          local_78.m_data._M_elems[0x10] = 'f';
          local_78.m_data._M_elems[0x11] = 0xd9;
          local_78.m_data._M_elems[0x12] = 0xe3;
          local_78.m_data._M_elems[0x13] = 0xce;
          local_78.m_data._M_elems[0x14] = '\x1a';
          local_78.m_data._M_elems[0x15] = '+';
          local_78.m_data._M_elems[0x16] = 'y';
          local_78.m_data._M_elems[0x17] = 0xd4;
          local_78.m_data._M_elems[0x18] = 0xae;
          local_78.m_data._M_elems[0x19] = 0xf0;
          local_78.m_data._M_elems[0x1a] = '\n';
          local_78.m_data._M_elems[0x1b] = '\0';
          local_78.m_data._M_elems[0x1c] = '\0';
          local_78.m_data._M_elems[0x1d] = '\0';
          local_78.m_data._M_elems[0x1e] = '\0';
          local_78.m_data._M_elems[0x1f] = '\0';
          bVar3 = ::operator==((base_blob<256U> *)&hash,&local_78);
        }
        else {
          bVar3 = false;
        }
      }
      uVar7 = (ulong)((long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
      bVar12 = 1;
      bVar13 = 1;
      while( true ) {
        uVar8 = (int)uVar7 - 1;
        if ((int)uVar8 < 0) break;
        this_00 = (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
        ;
        hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
        ;
        bVar4 = CTransaction::IsCoinBase(this_00);
        lVar10 = 8;
        for (uVar14 = 0;
            pCVar2 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar14 < (ulong)(((long)(this_00->vout).
                                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pCVar2) / 0x28);
            uVar14 = uVar14 + 1) {
          bVar5 = CScript::IsUnspendable((CScript *)((long)&pCVar2->nValue + lVar10));
          if (!bVar5) {
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
            out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                 hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
            out.n = (uint32_t)uVar14;
            Coin::Coin((Coin *)&coin.out);
            bVar5 = CCoinsViewCache::SpendCoin(view,&out,(Coin *)&coin.out);
            if (((((!bVar5) ||
                  (bVar5 = operator!=((CTxOut *)
                                      ((long)(this_00->vout).
                                             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar10 + -8)
                                      ,&coin.out), bVar5)) ||
                 (pindex->nHeight != (uint)coin._40_4_ >> 1)) || (((coin._40_1_ ^ bVar4) & 1) != 0))
               && (bVar13 = bVar12, (bVar3 & bVar4) == 0)) {
              bVar12 = 0;
              bVar13 = 0;
            }
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      (&coin.out.scriptPubKey.super_CScriptBase);
          }
          lVar10 = lVar10 + 0x28;
        }
        if (uVar8 != 0) {
          uVar8 = (int)uVar7 - 2;
          uVar14 = ((long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8].vprevout.
                          super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar8].vprevout.
                         super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x30;
          if (uVar14 != ((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68) {
            logging_function_00._M_str = "DisconnectBlock";
            logging_function_00._M_len = 0xf;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x5e;
            LogPrintFormatInternal<>
                      (logging_function_00,source_file_00,0x908,ALL,Error,
                       (ConstevalFormatString<0U>)0x6c369c);
            goto LAB_0035cc49;
          }
          pCVar11 = blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar8;
          uVar14 = uVar14 & 0xffffffff;
          lVar10 = uVar14 * 0x30 + -0x30;
          lVar15 = uVar14 * 0x68;
          while( true ) {
            if (lVar10 + -0x30 == -0x60) break;
            iVar6 = ApplyTxInUndo((Coin *)((long)&(((pCVar11->vprevout).
                                                    super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                    _M_impl.super__Vector_impl_data._M_start)->out).
                                                  nValue + lVar10),view,
                                  (COutPoint *)
                                  ((long)&(this_00->vin).
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_start[-1].prevout.hash + lVar15
                                  ));
            bVar13 = bVar13 & iVar6 != 1;
            lVar10 = lVar10 + -0x30;
            bVar12 = bVar13;
            lVar15 = lVar15 + -0x68;
            if (iVar6 == 2) goto LAB_0035cc49;
          }
        }
        uVar7 = uVar7 - 1;
      }
      CBlockIndex::GetBlockHash((uint256 *)&coin,pindex->pprev);
      CCoinsViewCache::SetBestBlock(view,(uint256 *)&coin);
      DVar9 = (DisconnectResult)(~bVar13 & 1);
      goto LAB_0035cc4c;
    }
    fmt = "DisconnectBlock(): block and undo data inconsistent\n";
    iVar6 = 0x8e1;
  }
  else {
    fmt = "DisconnectBlock(): failure reading undo data\n";
    iVar6 = 0x8dc;
  }
  logging_function._M_str = "DisconnectBlock";
  logging_function._M_len = 0xf;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  LogPrintFormatInternal<>
            (logging_function,source_file,iVar6,ALL,Error,(ConstevalFormatString<0U>)fmt);
LAB_0035cc49:
  DVar9 = DISCONNECT_FAILED;
LAB_0035cc4c:
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockUndo.vtxundo);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return DVar9;
}

Assistant:

DisconnectResult Chainstate::DisconnectBlock(const CBlock& block, const CBlockIndex* pindex, CCoinsViewCache& view)
{
    AssertLockHeld(::cs_main);
    bool fClean = true;

    CBlockUndo blockUndo;
    if (!m_blockman.UndoReadFromDisk(blockUndo, *pindex)) {
        LogError("DisconnectBlock(): failure reading undo data\n");
        return DISCONNECT_FAILED;
    }

    if (blockUndo.vtxundo.size() + 1 != block.vtx.size()) {
        LogError("DisconnectBlock(): block and undo data inconsistent\n");
        return DISCONNECT_FAILED;
    }

    // Ignore blocks that contain transactions which are 'overwritten' by later transactions,
    // unless those are already completely spent.
    // See https://github.com/bitcoin/bitcoin/issues/22596 for additional information.
    // Note: the blocks specified here are different than the ones used in ConnectBlock because DisconnectBlock
    // unwinds the blocks in reverse. As a result, the inconsistency is not discovered until the earlier
    // blocks with the duplicate coinbase transactions are disconnected.
    bool fEnforceBIP30 = !((pindex->nHeight==91722 && pindex->GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
                           (pindex->nHeight==91812 && pindex->GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"}));

    // undo transactions in reverse order
    for (int i = block.vtx.size() - 1; i >= 0; i--) {
        const CTransaction &tx = *(block.vtx[i]);
        Txid hash = tx.GetHash();
        bool is_coinbase = tx.IsCoinBase();
        bool is_bip30_exception = (is_coinbase && !fEnforceBIP30);

        // Check that all outputs are available and match the outputs in the block itself
        // exactly.
        for (size_t o = 0; o < tx.vout.size(); o++) {
            if (!tx.vout[o].scriptPubKey.IsUnspendable()) {
                COutPoint out(hash, o);
                Coin coin;
                bool is_spent = view.SpendCoin(out, &coin);
                if (!is_spent || tx.vout[o] != coin.out || pindex->nHeight != coin.nHeight || is_coinbase != coin.fCoinBase) {
                    if (!is_bip30_exception) {
                        fClean = false; // transaction output mismatch
                    }
                }
            }
        }

        // restore inputs
        if (i > 0) { // not coinbases
            CTxUndo &txundo = blockUndo.vtxundo[i-1];
            if (txundo.vprevout.size() != tx.vin.size()) {
                LogError("DisconnectBlock(): transaction and undo data inconsistent\n");
                return DISCONNECT_FAILED;
            }
            for (unsigned int j = tx.vin.size(); j > 0;) {
                --j;
                const COutPoint& out = tx.vin[j].prevout;
                int res = ApplyTxInUndo(std::move(txundo.vprevout[j]), view, out);
                if (res == DISCONNECT_FAILED) return DISCONNECT_FAILED;
                fClean = fClean && res != DISCONNECT_UNCLEAN;
            }
            // At this point, all of txundo.vprevout should have been moved out.
        }
    }

    // move best block pointer to prevout block
    view.SetBestBlock(pindex->pprev->GetBlockHash());

    return fClean ? DISCONNECT_OK : DISCONNECT_UNCLEAN;
}